

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O3

AssertionResult * __thiscall iutest::AssertionResult::operator<<(AssertionResult *this,int *value)

{
  Message msg;
  long *local_1c0;
  long local_1b0 [2];
  undefined1 local_1a0 [392];
  
  iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_1a0);
  detail::iuStreamMessage::operator<<((iuStreamMessage *)local_1a0,value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_append((char *)this,(ulong)local_1c0);
  if (local_1c0 != local_1b0) {
    operator_delete(local_1c0,local_1b0[0] + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  return this;
}

Assistant:

AssertionResult& operator << (const T& value)
    {
        Message msg;
        msg << value;
        m_message += msg.GetString();
        return *this;
    }